

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

void __thiscall
TTD::ExecutionInfoManager::PopCallEventException
          (ExecutionInfoManager *this,JavascriptFunction *function)

{
  int64 topLevelETime;
  bool bVar1;
  SingleCallCounter *pSVar2;
  SingleCallCounter local_60;
  JavascriptFunction *local_18;
  JavascriptFunction *function_local;
  ExecutionInfoManager *this_local;
  
  local_18 = function;
  function_local = (JavascriptFunction *)this;
  bVar1 = TTLastReturnLocationInfo::IsExceptionLocation(&this->m_lastReturnLocation);
  if (!bVar1) {
    pSVar2 = JsUtil::
             List<TTD::SingleCallCounter,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Last(&this->m_callStack);
    TTLastReturnLocationInfo::SetExceptionLocation(&this->m_lastReturnLocation,pSVar2);
  }
  if ((this->m_lastExceptionPropagating & 1U) == 0) {
    topLevelETime = this->m_topLevelCallbackEventTime;
    pSVar2 = JsUtil::
             List<TTD::SingleCallCounter,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Last(&this->m_callStack);
    TTDebuggerSourceLocation::SetLocationFromFrame
              (&this->m_lastExceptionLocation,topLevelETime,pSVar2);
    this->m_lastExceptionPropagating = true;
  }
  this->m_runningFunctionTimeCtr = this->m_runningFunctionTimeCtr + 1;
  JsUtil::
  List<TTD::SingleCallCounter,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::RemoveAtEnd(&local_60,&this->m_callStack);
  return;
}

Assistant:

void ExecutionInfoManager::PopCallEventException(Js::JavascriptFunction* function)
    {
        //If we already have the last return as an exception then just leave it.
        //That is where the exception was first rasied, this return is just propagating it in this return.

        if(!this->m_lastReturnLocation.IsExceptionLocation())
        {
            this->m_lastReturnLocation.SetExceptionLocation(this->m_callStack.Last());
        }

        if(!this->m_lastExceptionPropagating)
        {
            this->m_lastExceptionLocation.SetLocationFromFrame(this->m_topLevelCallbackEventTime, this->m_callStack.Last());
            this->m_lastExceptionPropagating = true;
        }

        this->m_runningFunctionTimeCtr++;
        this->m_callStack.RemoveAtEnd();

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_diagnosticLogger.WriteReturnException(function, function->GetFunctionBody()->GetScriptContext()->GetThreadContext()->TTDLog->GetLastEventTime());
#endif
    }